

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_dep_parser.cc
# Opt level: O1

void DepParserTask::get_gold_actions
               (search *sch,uint32_t idx,uint64_t param_3,v_array<unsigned_int> *gold_actions)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  int *piVar4;
  ulong uVar5;
  long lVar6;
  uint *puVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  uint local_34;
  
  pvVar3 = sch->task_data;
  v_array<unsigned_int>::clear(gold_actions);
  lVar6 = *(long *)((long)pvVar3 + 0xa0);
  if (lVar6 == *(long *)((long)pvVar3 + 0x98)) {
    uVar11 = 0;
  }
  else {
    uVar11 = (ulong)*(uint *)(lVar6 + -4);
  }
  if (*(int *)((long)pvVar3 + 0x2c4) != 1) goto LAB_00262098;
  piVar4 = *(int **)((long)pvVar3 + 0x18);
  lVar8 = *(long *)((long)pvVar3 + 0x20) - (long)piVar4;
  bVar12 = lVar8 != 0;
  if (lVar8 == 0) {
LAB_00262006:
    if (bVar12) goto LAB_0026200b;
  }
  else {
    uVar9 = lVar8 >> 2;
    if (*piVar4 != 1) {
      uVar5 = 1;
      do {
        uVar10 = uVar5;
        if (uVar9 + (uVar9 == 0) == uVar10) break;
        uVar5 = uVar10 + 1;
      } while (piVar4[uVar10] != 1);
      bVar12 = uVar10 < uVar9;
      goto LAB_00262006;
    }
LAB_0026200b:
    if ((*(long *)((long)pvVar3 + 0x98) == lVar6) ||
       ((int)uVar11 == *(int *)(*(long *)((long)pvVar3 + 0x58) + (ulong)idx * 4))) {
      puVar7 = &SHIFT;
      goto LAB_00262022;
    }
  }
  piVar4 = *(int **)((long)pvVar3 + 0x18);
  lVar6 = *(long *)((long)pvVar3 + 0x20) - (long)piVar4;
  bVar12 = lVar6 != 0;
  if (lVar6 == 0) {
LAB_00262081:
    if (!bVar12) goto LAB_00262098;
  }
  else {
    uVar9 = lVar6 >> 2;
    if (*piVar4 != 3) {
      uVar5 = 1;
      do {
        uVar10 = uVar5;
        if (uVar9 + (uVar9 == 0) == uVar10) break;
        uVar5 = uVar10 + 1;
      } while (piVar4[uVar10] != 3);
      bVar12 = uVar10 < uVar9;
      goto LAB_00262081;
    }
  }
  if (*(uint32_t *)(*(long *)((long)pvVar3 + 0x58) + uVar11 * 4) == idx) {
    puVar7 = &REDUCE_LEFT;
LAB_00262022:
    v_array<unsigned_int>::push_back(gold_actions,puVar7);
    return;
  }
LAB_00262098:
  local_34 = 1;
  uVar11 = 1;
  do {
    if ((local_34 != 4) || (*(int *)((long)pvVar3 + 0x2c4) != 1)) {
      uVar1 = *(uint *)(*(long *)((long)pvVar3 + 0x38) + (ulong)local_34 * 4);
      uVar2 = *(uint *)(*(long *)((long)pvVar3 + 0x38) + uVar11 * 4);
      if (uVar1 < uVar2) {
        puVar7 = *(uint **)((long)pvVar3 + 0x18);
        lVar6 = *(long *)((long)pvVar3 + 0x20) - (long)puVar7;
        bVar12 = lVar6 != 0;
        if (lVar6 == 0) {
LAB_00262118:
          if (!bVar12) goto LAB_0026212a;
        }
        else {
          uVar9 = lVar6 >> 2;
          if (*puVar7 != local_34) {
            uVar5 = 1;
            do {
              uVar10 = uVar5;
              if (uVar9 + (uVar9 == 0) == uVar10) break;
              uVar5 = uVar10 + 1;
            } while (puVar7[uVar10] != local_34);
            bVar12 = uVar10 < uVar9;
            goto LAB_00262118;
          }
        }
        v_array<unsigned_int>::clear(gold_actions);
        uVar11 = (ulong)local_34;
LAB_00262175:
        v_array<unsigned_int>::push_back(gold_actions,&local_34);
      }
      else {
LAB_0026212a:
        if (uVar1 == uVar2) {
          puVar7 = *(uint **)((long)pvVar3 + 0x18);
          lVar6 = *(long *)((long)pvVar3 + 0x20) - (long)puVar7;
          bVar12 = lVar6 != 0;
          if (bVar12) {
            uVar9 = lVar6 >> 2;
            if (*puVar7 == local_34) goto LAB_00262175;
            uVar5 = 1;
            do {
              uVar10 = uVar5;
              if (uVar9 + (uVar9 == 0) == uVar10) break;
              uVar5 = uVar10 + 1;
            } while (puVar7[uVar10] != local_34);
            bVar12 = uVar10 < uVar9;
          }
          if (bVar12) goto LAB_00262175;
        }
      }
    }
    local_34 = local_34 + 1;
    if (4 < local_34) {
      return;
    }
  } while( true );
}

Assistant:

void get_gold_actions(Search::search &sch, uint32_t idx, uint64_t /* n */, v_array<action> &gold_actions)
{
  task_data *data = sch.get_task_data<task_data>();
  v_array<uint32_t> &action_loss = data->action_loss, &stack = data->stack, &gold_heads = data->gold_heads,
                    &valid_actions = data->valid_actions;
  gold_actions.clear();
  size_t size = stack.size();
  size_t last = (size == 0) ? 0 : stack.last();
  uint32_t &sys = data->transition_system;

  if (sys == arc_hybrid && is_valid(SHIFT, valid_actions) && (stack.empty() || gold_heads[idx] == last))
  {
    gold_actions.push_back(SHIFT);
    return;
  }

  if (sys == arc_hybrid && is_valid(REDUCE_LEFT, valid_actions) && gold_heads[last] == idx)
  {
    gold_actions.push_back(REDUCE_LEFT);
    return;
  }
  size_t best_action = 1;
  size_t count = 0;
  for (uint32_t i = 1; i <= 4; i++)
  {
    if (i == 4 && sys == arc_hybrid)
      continue;
    if (action_loss[i] < action_loss[best_action] && is_valid(i, valid_actions))
    {
      best_action = i;
      count = 1;
      gold_actions.clear();
      gold_actions.push_back(i);
    }
    else if (action_loss[i] == action_loss[best_action] && is_valid(i, valid_actions))
    {
      count++;
      gold_actions.push_back(i);
    }
  }
}